

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

int Col_WordType(Col_Word word)

{
  uint uVar1;
  uint local_24;
  uint local_20;
  uint local_1c;
  Col_Word word_local;
  
  if (word == 0) {
    local_1c = 0;
  }
  else {
    if ((word & 0xf) == 0) {
      if ((*(byte *)word & 2) == 0) {
        local_24 = 0xffffffff;
      }
      else {
        local_24 = *(byte *)word & 0xfffffffe;
      }
      local_20 = local_24;
    }
    else {
      local_20 = immediateWordTypes[word & 0x1f];
    }
    local_1c = local_20;
  }
  switch(local_1c) {
  case 0:
    word_local._4_4_ = 0;
    break;
  default:
    word_local._4_4_ = 0;
    break;
  case 2:
    word_local._4_4_ = (uint)*(ushort *)(word + 2);
    break;
  case 6:
    word_local._4_4_ = 0x60;
    break;
  case 10:
    word_local._4_4_ = 0x60;
    break;
  case 0xe:
  case 0x12:
    word_local._4_4_ = 0x40;
    break;
  case 0x16:
    word_local._4_4_ = 0x280;
    break;
  case 0x1a:
    word_local._4_4_ = 0x380;
    break;
  case 0x1e:
  case 0x22:
    word_local._4_4_ = 0x200;
    break;
  case 0x26:
    word_local._4_4_ = 0x600;
    break;
  case 0x2a:
    word_local._4_4_ = 0x2800;
    break;
  case 0x2e:
    word_local._4_4_ = 0x3000;
    break;
  case 0x42:
    word_local._4_4_ = 0x4800;
    break;
  case 0x46:
    word_local._4_4_ = 0x5000;
    break;
  case 0x72:
    word_local._4_4_ = 0x8000;
    break;
  case 0xfffffff9:
    uVar1 = 0;
    if (word >> 5 == 0) {
      uVar1 = 0x80;
    }
    word_local._4_4_ = uVar1 | 0x200;
    break;
  case 0xfffffffa:
    word_local._4_4_ = 0x200;
    break;
  case 0xfffffffb:
    word_local._4_4_ = 0x60;
    break;
  case 0xfffffffc:
    word_local._4_4_ = 2;
    if ((word >> 5 & 7) != 0) {
      word_local._4_4_ = 0x70;
    }
    break;
  case 0xfffffffd:
    word_local._4_4_ = 8;
    break;
  case 0xfffffffe:
    word_local._4_4_ = 4;
    break;
  case 0xffffffff:
    if (*(int *)(*(ulong *)word & 0xfffffffffffffffe) == 0x2000) {
      word_local._4_4_ = 0x2801;
    }
    else if (*(int *)(*(ulong *)word & 0xfffffffffffffffe) == 0x4000) {
      word_local._4_4_ = 0x4801;
    }
    else {
      word_local._4_4_ = *(uint *)(*(ulong *)word & 0xfffffffffffffffe) | 1;
    }
  }
  return word_local._4_4_;
}

Assistant:

int
Col_WordType(
    Col_Word word)  /*!< The word to get type for. */
{
    switch (WORD_TYPE(word)) {
    /*
     * Immediate words.
     */

    case WORD_TYPE_NIL:
        return COL_NIL;

    case WORD_TYPE_SMALLINT:
        return COL_INT;

    case WORD_TYPE_SMALLFP:
        return COL_FLOAT;

    case WORD_TYPE_CHARBOOL:
        return (WORD_CHAR_WIDTH(word) ? COL_CHAR | COL_STRING | COL_ROPE
            : COL_BOOL);

    case WORD_TYPE_SMALLSTR:
        return COL_STRING | COL_ROPE;

    case WORD_TYPE_CIRCLIST:
        return COL_LIST;

    case WORD_TYPE_VOIDLIST:
        return (WORD_VOIDLIST_LENGTH(word) == 0 ? COL_VECTOR : 0) | COL_LIST;

    /*
     * Predefined types.
     */

    case WORD_TYPE_WRAP:
        return WORD_WRAP_TYPE(word);

    case WORD_TYPE_UCSSTR:
        return COL_STRING | COL_ROPE;

    case WORD_TYPE_UTFSTR:
        return COL_STRING | COL_ROPE;

    case WORD_TYPE_SUBROPE:
    case WORD_TYPE_CONCATROPE:
        return COL_ROPE;

    case WORD_TYPE_VECTOR:
        return COL_VECTOR | COL_LIST;

    case WORD_TYPE_MVECTOR:
        return COL_MVECTOR | COL_VECTOR | COL_LIST;

    case WORD_TYPE_SUBLIST:
    case WORD_TYPE_CONCATLIST:
        return COL_LIST;

    case WORD_TYPE_STRHASHMAP:
        return COL_MAP | COL_HASHMAP;

    case WORD_TYPE_INTHASHMAP:
        return COL_INTMAP | COL_HASHMAP;

    case WORD_TYPE_STRTRIEMAP:
        return COL_MAP | COL_TRIEMAP;

    case WORD_TYPE_INTTRIEMAP:
        return COL_INTMAP | COL_TRIEMAP;

    case WORD_TYPE_STRBUF:
        return COL_STRBUF;

    /*
     * Mutable concat list nodes are only used internally, but handle them here
     * anyway for proper type checking in list procs.
     */

    case WORD_TYPE_MCONCATLIST:
        return COL_MLIST | COL_LIST;

    /*
     * Custom word.
     */

    case WORD_TYPE_CUSTOM:
        switch (WORD_TYPEINFO(word)->type) {
        case COL_HASHMAP: return COL_CUSTOM | COL_MAP | COL_HASHMAP;
        case COL_TRIEMAP: return COL_CUSTOM | COL_MAP | COL_TRIEMAP;
        default:          return COL_CUSTOM | WORD_TYPEINFO(word)->type;
        }

    /* WORD_TYPE_UNKNOWN */

    default:
        /* CANTHAPPEN */
        ASSERT(0);
        return 0;
    }
}